

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_msgclr(DisasContext_conflict10 *ctx)

{
  TCGContext_conflict10 *tcg_ctx_00;
  TCGv_ptr pTVar1;
  uint32_t uVar2;
  byte local_19;
  TCGContext_conflict10 *tcg_ctx;
  DisasContext_conflict10 *ctx_local;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  local_19 = 1;
  if ((ctx->pr & 1U) == 0) {
    local_19 = ctx->hv ^ 0xff;
  }
  if ((local_19 & 1) == 0) {
    if ((ctx->insns_flags & 0x200000000000) == 0) {
      pTVar1 = tcg_ctx_00->cpu_env;
      uVar2 = rB(ctx->opcode);
      gen_helper_msgclr(tcg_ctx_00,pTVar1,cpu_gpr[uVar2]);
    }
    else {
      pTVar1 = tcg_ctx_00->cpu_env;
      uVar2 = rB(ctx->opcode);
      gen_helper_book3s_msgclr(tcg_ctx_00,pTVar1,cpu_gpr[uVar2]);
    }
  }
  else {
    gen_priv_exception(ctx,1);
  }
  return;
}

Assistant:

static void gen_msgclr(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    CHK_HV;
    if (is_book3s_arch2x(ctx)) {
        gen_helper_book3s_msgclr(tcg_ctx, tcg_ctx->cpu_env, cpu_gpr[rB(ctx->opcode)]);
    } else {
        gen_helper_msgclr(tcg_ctx, tcg_ctx->cpu_env, cpu_gpr[rB(ctx->opcode)]);
    }
}